

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

FilterPropagateResult
duckdb::CheckParquetStringFilter(BaseStatistics *stats,Statistics *pq_col_stats,TableFilter *filter)

{
  ConstantFilter CVar1;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *puVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar *puVar5;
  ulong uVar6;
  FilterPropagateResult FVar7;
  FilterPropagateResult FVar8;
  ConjunctionAndFilter *pCVar9;
  type filter_00;
  ConstantFilter *pCVar10;
  string *psVar11;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *this;
  
  if (filter[8] == (TableFilter)0x0) {
    pCVar10 = TableFilter::Cast<duckdb::ConstantFilter>(filter);
    puVar3 = (uchar *)(pq_col_stats->min_value)._M_dataplus._M_p;
    uVar4 = (pq_col_stats->min_value)._M_string_length;
    puVar5 = (uchar *)(pq_col_stats->max_value)._M_dataplus._M_p;
    uVar6 = (pq_col_stats->max_value)._M_string_length;
    CVar1 = pCVar10[9];
    psVar11 = (string *)duckdb::StringValue::Get_abi_cxx11_((Value *)(pCVar10 + 0x10));
    FVar8 = duckdb::StringStats::CheckZonemap
                      (puVar3,uVar4,puVar5,uVar6,(ExpressionType)CVar1,psVar11);
    return FVar8;
  }
  if (filter[8] == (TableFilter)0x4) {
    pCVar9 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    this = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
            (pCVar9 + 0x10);
    puVar2 = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
              (pCVar9 + 0x18);
    FVar8 = FILTER_ALWAYS_TRUE;
    while( true ) {
      if (this == puVar2) {
        return FVar8;
      }
      filter_00 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(this);
      FVar7 = CheckParquetStringFilter(stats,pq_col_stats,filter_00);
      if (FVar7 == FILTER_ALWAYS_FALSE) break;
      if (FVar7 != FVar8) {
        FVar8 = NO_PRUNING_POSSIBLE;
      }
      this = this + 1;
    }
    return FILTER_ALWAYS_FALSE;
  }
  FVar8 = (**(code **)(*(long *)filter + 0x10))(filter,stats);
  return FVar8;
}

Assistant:

static FilterPropagateResult CheckParquetStringFilter(BaseStatistics &stats, const Statistics &pq_col_stats,
                                                      TableFilter &filter) {
	switch (filter.filter_type) {
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_filter = filter.Cast<ConjunctionAndFilter>();
		auto and_result = FilterPropagateResult::FILTER_ALWAYS_TRUE;
		for (auto &child_filter : conjunction_filter.child_filters) {
			auto child_prune_result = CheckParquetStringFilter(stats, pq_col_stats, *child_filter);
			if (child_prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
				return FilterPropagateResult::FILTER_ALWAYS_FALSE;
			}
			if (child_prune_result != and_result) {
				and_result = FilterPropagateResult::NO_PRUNING_POSSIBLE;
			}
		}
		return and_result;
	}
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = filter.Cast<ConstantFilter>();
		auto &min_value = pq_col_stats.min_value;
		auto &max_value = pq_col_stats.max_value;
		return StringStats::CheckZonemap(const_data_ptr_cast(min_value.c_str()), min_value.size(),
		                                 const_data_ptr_cast(max_value.c_str()), max_value.size(),
		                                 constant_filter.comparison_type, StringValue::Get(constant_filter.constant));
	}
	default:
		return filter.CheckStatistics(stats);
	}
}